

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

void __thiscall mkvparser::ContentEncoding::~ContentEncoding(ContentEncoding *this)

{
  ContentCompression **ppCVar1;
  ContentCompression *pCVar2;
  ContentEncryption **ppCVar3;
  ContentEncryption *this_00;
  ContentCompression **ppCVar4;
  ContentEncryption **ppCVar5;
  
  ppCVar1 = this->compression_entries_end_;
  for (ppCVar4 = this->compression_entries_; ppCVar4 != ppCVar1; ppCVar4 = ppCVar4 + 1) {
    pCVar2 = *ppCVar4;
    if (pCVar2 != (ContentCompression *)0x0) {
      if (pCVar2->settings != (uchar *)0x0) {
        operator_delete__(pCVar2->settings);
      }
      operator_delete(pCVar2);
    }
  }
  if (this->compression_entries_ != (ContentCompression **)0x0) {
    operator_delete__(this->compression_entries_);
  }
  ppCVar3 = this->encryption_entries_end_;
  for (ppCVar5 = this->encryption_entries_; ppCVar5 != ppCVar3; ppCVar5 = ppCVar5 + 1) {
    this_00 = *ppCVar5;
    if (this_00 != (ContentEncryption *)0x0) {
      ContentEncryption::~ContentEncryption(this_00);
      operator_delete(this_00);
    }
  }
  if (this->encryption_entries_ != (ContentEncryption **)0x0) {
    operator_delete__(this->encryption_entries_);
    return;
  }
  return;
}

Assistant:

ContentEncoding::~ContentEncoding() {
  ContentCompression** comp_i = compression_entries_;
  ContentCompression** const comp_j = compression_entries_end_;

  while (comp_i != comp_j) {
    ContentCompression* const comp = *comp_i++;
    delete comp;
  }

  delete[] compression_entries_;

  ContentEncryption** enc_i = encryption_entries_;
  ContentEncryption** const enc_j = encryption_entries_end_;

  while (enc_i != enc_j) {
    ContentEncryption* const enc = *enc_i++;
    delete enc;
  }

  delete[] encryption_entries_;
}